

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::renameFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  uint uVar2;
  uint src_00;
  int iVar3;
  string newName;
  string oldName;
  
  requireDStackDepth(this,4,"RENAME-FILE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src_00 = ForthStack<unsigned_int>::getTop(this_00);
  oldName._M_dataplus._M_p = (pointer)&oldName.field_2;
  oldName._M_string_length = 0;
  oldName.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&oldName,src_00,(ulong)uVar2);
  newName._M_dataplus._M_p = (pointer)&newName.field_2;
  newName._M_string_length = 0;
  newName.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&newName,src,(ulong)uVar1);
  iVar3 = rename(oldName._M_dataplus._M_p,newName._M_dataplus._M_p);
  uVar1 = 0xffffffb8;
  if (iVar3 == 0) {
    uVar1 = 0;
  }
  ForthStack<unsigned_int>::setTop(this_00,uVar1);
  std::__cxx11::string::~string((string *)&newName);
  std::__cxx11::string::~string((string *)&oldName);
  return;
}

Assistant:

void renameFile() {
	REQUIRE_DSTACK_DEPTH(4, "RENAME-FILE");
	auto lengthNew = SIZE_T(dStack.getTop()); pop();
	auto caddrNew = (dStack.getTop()); pop();
	auto lengthOld = SIZE_T(dStack.getTop()); pop();
	auto caddrOld = (dStack.getTop());
	std::string oldName{};
	moveFromDataSpace(oldName, caddrOld, lengthOld);
	std::string newName{};
	moveFromDataSpace(newName, caddrNew, lengthNew);
	auto result = std::rename(oldName.c_str(), newName.c_str());
	dStack.setTop(static_cast<Cell>(result?errorRenameFile:0));
}